

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

void mriStep_DisableLSetup(ARKodeMem ark_mem)

{
  int iVar1;
  ARKodeMRIStepMem in_RAX;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_8;
  
  local_8 = in_RAX;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_DisableLSetup",&local_8);
  if (iVar1 == 0) {
    local_8->lsetup = (ARKLinsolSetupFn)0x0;
  }
  return;
}

Assistant:

void mriStep_DisableLSetup(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* nullify the lsetup function pointer */
  step_mem->lsetup = NULL;
}